

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

void skynet_globalinit(void)

{
  int iVar1;
  
  G_NODE.total = 0;
  G_NODE.monitor_exit = 0;
  G_NODE.init = 1;
  iVar1 = pthread_key_create(&G_NODE.handle_key,(__destr_function *)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"pthread_key_create failed");
    exit(1);
  }
  skynet_initthread(1);
  return;
}

Assistant:

void 
skynet_globalinit(void) {
	G_NODE.total = 0;
	G_NODE.monitor_exit = 0;
	G_NODE.init = 1;
	if (pthread_key_create(&G_NODE.handle_key, NULL)) {
		fprintf(stderr, "pthread_key_create failed");
		exit(1);
	}
	// set mainthread's key
	skynet_initthread(THREAD_MAIN);
}